

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

TidyMessageImpl *
formatDialogue(TidyDocImpl *doc,uint code,TidyReportLevel level,__va_list_tag *args)

{
  uint uVar1;
  uint uVar2;
  ctmbstr ptVar3;
  ctmbstr ptVar4;
  TidyMessageImpl *pTVar5;
  undefined8 *local_48;
  ctmbstr str;
  __va_list_tag *args_local;
  TidyReportLevel level_local;
  uint code_local;
  TidyDocImpl *doc_local;
  
  if ((code != 0x1fa) && (0xc < code - 0x205)) {
    if (code == 0x212) {
LAB_00167ab0:
      uVar1 = args->gp_offset;
      if (uVar1 < 0x29) {
        local_48 = (undefined8 *)((long)(int)uVar1 + (long)args->reg_save_area);
        args->gp_offset = uVar1 + 8;
      }
      else {
        local_48 = (undefined8 *)args->overflow_arg_area;
        args->overflow_arg_area = local_48 + 1;
      }
      pTVar5 = prvTidytidyMessageCreate(doc,code,level,*local_48);
      return pTVar5;
    }
    if (5 < code - 0x213) {
      if (code == 0x219) goto LAB_00167ab0;
      if ((code == 0x21b) || ((1 < code - 0x21c && (code == 0x21e)))) {
        uVar1 = doc->warnings;
        ptVar3 = tidyLocalizedStringN(0x1f9,doc->warnings);
        uVar2 = doc->errors;
        ptVar4 = tidyLocalizedStringN(0x1f8,doc->errors);
        pTVar5 = prvTidytidyMessageCreate(doc,code,level,(ulong)uVar1,ptVar3,(ulong)uVar2,ptVar4);
        return pTVar5;
      }
    }
  }
  pTVar5 = prvTidytidyMessageCreate(doc,code,level);
  return pTVar5;
}

Assistant:

TidyMessageImpl *formatDialogue( TidyDocImpl* doc, uint code, TidyReportLevel level, va_list args )
{
    switch (code)
    {
        case TEXT_SGML_CHARS:
        case TEXT_VENDOR_CHARS:
        {
            ctmbstr str = va_arg(args, ctmbstr);
            return TY_(tidyMessageCreate)( doc, code, level, str );
        }
            
        case STRING_ERROR_COUNT:
        case STRING_NOT_ALL_SHOWN:
            return TY_(tidyMessageCreate)( doc, code, level,
                                           doc->warnings, tidyLocalizedStringN( STRING_ERROR_COUNT_WARNING, doc->warnings ),
                                           doc->errors, tidyLocalizedStringN( STRING_ERROR_COUNT_ERROR, doc->errors ) );

        case FOOTNOTE_TRIM_EMPTY_ELEMENT:
        case STRING_HELLO_ACCESS:
        case STRING_NEEDS_INTERVENTION:
        case STRING_NO_ERRORS:
        case TEXT_ACCESS_ADVICE1:
        case TEXT_ACCESS_ADVICE2:
        case TEXT_BAD_FORM:
        case TEXT_BAD_MAIN:
        case TEXT_GENERAL_INFO:
        case TEXT_GENERAL_INFO_PLEA:
        case TEXT_HTML_T_ALGORITHM:
        case TEXT_INVALID_URI:
        case TEXT_INVALID_UTF8:
        case TEXT_INVALID_UTF16:
        case TEXT_M_IMAGE_ALT:
        case TEXT_M_IMAGE_MAP:
        case TEXT_M_LINK_ALT:
        case TEXT_M_SUMMARY:
        case TEXT_USING_BODY:
        case TEXT_USING_FONT:
        case TEXT_USING_FRAMES:
        case TEXT_USING_LAYER:
        case TEXT_USING_NOBR:
        case TEXT_USING_SPACER:
        default:
            return TY_(tidyMessageCreate)( doc, code, level );
    }
    
    return NULL;
}